

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool run_container_equals_array(run_container_t *container1,array_container_t *container2)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  uVar3 = croaring_hardware_support();
  if ((uVar3 & 2) == 0) {
    uVar3 = croaring_hardware_support();
    if ((uVar3 & 1) == 0) {
      iVar4 = container1->n_runs;
      lVar5 = (long)iVar4;
      if (0 < lVar5) {
        lVar7 = 0;
        do {
          iVar4 = iVar4 + (uint)container1->runs[lVar7].length;
          lVar7 = lVar7 + 1;
        } while (lVar5 != lVar7);
      }
    }
    else {
      iVar4 = _avx2_run_container_cardinality(container1);
    }
  }
  else {
    iVar4 = _avx512_run_container_cardinality(container1);
  }
  if (iVar4 == container2->cardinality) {
    uVar6 = (ulong)container1->n_runs;
    bVar2 = (long)uVar6 < 1;
    if (0 < (long)uVar6) {
      uVar8 = 0;
      iVar4 = 0;
      do {
        uVar1 = container1->runs[uVar8].value;
        if ((container2->array[iVar4] == uVar1) &&
           (uVar3 = (uint)container1->runs[uVar8].length,
           uVar1 + uVar3 == (uint)container2->array[iVar4 + uVar3])) {
          iVar4 = iVar4 + uVar3 + 1;
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
        if (!bVar2) goto LAB_00113a3a;
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
      bVar2 = uVar6 <= uVar8;
    }
  }
  else {
LAB_00113a3a:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool run_container_equals_array(const run_container_t* container1,
                                const array_container_t* container2) {
    if (run_container_cardinality(container1) != container2->cardinality)
        return false;
    int32_t pos = 0;
    for (int i = 0; i < container1->n_runs; ++i) {
        const uint32_t run_start = container1->runs[i].value;
        const uint32_t le = container1->runs[i].length;

        if (container2->array[pos] != run_start) {
            return false;
        }

        if (container2->array[pos + le] != run_start + le) {
            return false;
        }

        pos += le + 1;
    }
    return true;
}